

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool Internal_NotEqualFloatArray(size_t count,float *lhs,float *rhs)

{
  float fVar1;
  float fVar2;
  float y;
  float x;
  float *e;
  float *pfStack_28;
  bool rc;
  float *rhs_local;
  float *lhs_local;
  size_t count_local;
  
  e._7_1_ = false;
  pfStack_28 = rhs;
  rhs_local = lhs;
  while( true ) {
    while( true ) {
      if (lhs + count <= rhs_local) {
        return e._7_1_;
      }
      fVar1 = *rhs_local;
      fVar2 = *pfStack_28;
      if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) break;
      e._7_1_ = true;
      pfStack_28 = pfStack_28 + 1;
      rhs_local = rhs_local + 1;
    }
    if (NAN(fVar1)) break;
    pfStack_28 = pfStack_28 + 1;
    rhs_local = rhs_local + 1;
    if (NAN(fVar2)) {
      return false;
    }
  }
  return false;
}

Assistant:

static bool Internal_NotEqualFloatArray(size_t count, const float* lhs, const float* rhs)
{
  bool rc = false;
  const float* e = lhs + count; 
  while (lhs < e)
  {
    const float x = *lhs++;
    const float y = *rhs++;
    if (x != y)
    {
      // neither x nor y is a nan
      rc = true;
      continue;
    }
    if (!(x == x))
      return false; // nan
    if (!(y == y))
      return false; // nan
  }
  return rc;
}